

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CharStringType2Interpreter.cpp
# Opt level: O1

Byte * __thiscall
CharStringType2Interpreter::InterpretHintMask
          (CharStringType2Interpreter *this,Byte *inProgramCounter,LongFilePositionType inReadLimit)

{
  EStatusCode EVar1;
  int iVar2;
  Byte *pBVar3;
  ulong uVar4;
  
  EVar1 = AddStemsCount(this,(unsigned_short)
                             ((uint)(this->mOperandStack).
                                    super__List_base<CharStringOperand,_std::allocator<CharStringOperand>_>
                                    ._M_impl._M_node._M_size >> 1));
  if ((EVar1 == eSuccess) &&
     (iVar2 = (*this->mImplementationHelper->_vptr_IType2InterpreterImplementation[0xc])
                        (this->mImplementationHelper,this,inProgramCounter,inReadLimit), iVar2 == 0)
     ) {
    std::__cxx11::list<CharStringOperand,_std::allocator<CharStringOperand>_>::clear
              (&this->mOperandStack);
    uVar4 = (ulong)(((this->mStemsCount >> 3) + 1) - (uint)((this->mStemsCount & 7) == 0));
    pBVar3 = (Byte *)0x0;
    if ((long)uVar4 <= inReadLimit) {
      pBVar3 = inProgramCounter + uVar4;
    }
  }
  else {
    pBVar3 = (Byte *)0x0;
  }
  return pBVar3;
}

Assistant:

Byte* CharStringType2Interpreter::InterpretHintMask(Byte* inProgramCounter, LongFilePositionType inReadLimit)
{
	EStatusCode status = AddStemsCount((unsigned short)(mOperandStack.size() / 2)); // assuming this is a shortcut of dropping vstem if got arguments
	if(status != eSuccess)
		return NULL;	

	status = mImplementationHelper->Type2Hintmask(mOperandStack,inProgramCounter, inReadLimit);
	if(status != eSuccess)
		return NULL;

	ClearStack();
	LongFilePositionType programCounterStemReadSize = (mStemsCount/8 + (mStemsCount % 8 != 0 ? 1:0));
	if(programCounterStemReadSize > inReadLimit)
		return NULL;
	return inProgramCounter+programCounterStemReadSize;
}